

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O3

bool __thiscall
llbuild::buildsystem::ShellCommand::processDiscoveredDependencies
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context)

{
  StringRef depsPath;
  StringRef depsPath_00;
  bool bVar1;
  FileSystem *pFVar2;
  BuildSystemDelegate *pBVar3;
  long *plVar4;
  ulong uVar5;
  Twine *pTVar6;
  string *Str;
  Child input;
  SmallString<4096U> absPath;
  char *pcVar7;
  size_t sVar8;
  Child local_10e0;
  undefined8 local_10d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10d0;
  long local_10c0;
  Child local_10b8 [3];
  char *local_10a0;
  size_t sStack_1098;
  pointer local_1090;
  size_type sStack_1088;
  char *local_1080;
  size_t sStack_1078;
  Twine local_1070;
  Twine local_1058;
  Child local_1040;
  ulong local_1038;
  Twine *local_1030;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  
  if (this->depsStyle == Unused) {
    pBVar3 = BuildSystem::getDelegate(system);
    (*pBVar3->_vptr_BuildSystemDelegate[0xb])
              (pBVar3,this,"missing required \'deps-style\' specifier",0x27);
LAB_00177d54:
    bVar1 = false;
  }
  else {
    uVar5 = (ulong)(this->depsPaths).
                   super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   .
                   super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                   .super_SmallVectorBase.Size;
    bVar1 = true;
    if (uVar5 != 0) {
      Str = (string *)
            (this->depsPaths).
            super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            .
            super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            .super_SmallVectorBase.BeginX;
      local_10c0 = uVar5 << 5;
      do {
        llvm::Twine::Twine((Twine *)&local_1040,Str);
        bVar1 = llvm::sys::path::is_absolute((Twine *)&local_1040,native);
        if (bVar1) {
          pFVar2 = BuildSystem::getFileSystem(system);
          (*pFVar2->_vptr_FileSystem[4])(&local_1040,pFVar2,Str);
          input = local_1040;
        }
        else {
          pcVar7 = (this->workingDirectory)._M_dataplus._M_p;
          local_1038 = 0x100000000000;
          local_1040.twine = (Twine *)&local_1030;
          llvm::SmallVectorImpl<char>::append<char_const*,void>
                    ((SmallVectorImpl<char> *)&local_1040,pcVar7,
                     pcVar7 + (this->workingDirectory)._M_string_length);
          llvm::Twine::Twine((Twine *)&local_10e0,Str);
          llvm::Twine::Twine((Twine *)local_10b8,"");
          llvm::Twine::Twine(&local_1058,"");
          llvm::Twine::Twine(&local_1070,"");
          context = (QueueJobContext *)&local_1070;
          llvm::sys::path::append
                    ((SmallVectorImpl<char> *)&local_1040,(Twine *)&local_10e0,(Twine *)local_10b8,
                     &local_1058,(Twine *)context);
          llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)&local_1040);
          pFVar2 = BuildSystem::getFileSystem(system);
          if (local_1040.twine == (Twine *)0x0) {
            local_10e0.twine = (Twine *)&local_10d0;
            local_10d8 = 0;
            local_10d0._M_local_buf[0] = '\0';
          }
          else {
            local_10e0.twine = (Twine *)&local_10d0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_10e0,local_1040.twine,
                       (long)&(local_1040.twine)->LHS + (local_1038 & 0xffffffff));
          }
          (*pFVar2->_vptr_FileSystem[4])(local_10b8,pFVar2,&local_10e0);
          input = local_10b8[0];
          local_10b8[0].twine = (Twine *)0x0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10e0.twine != &local_10d0) {
            operator_delete(local_10e0.twine,
                            CONCAT71(local_10d0._M_allocated_capacity._1_7_,
                                     local_10d0._M_local_buf[0]) + 1);
          }
          if (local_1040.twine != (Twine *)&local_1030) {
            free(local_1040.twine);
          }
        }
        if (input.twine == (Twine *)0x0) {
          pBVar3 = BuildSystem::getDelegate(system);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_10e0,"unable to open dependencies file (",Str);
          plVar4 = (long *)std::__cxx11::string::append(&local_10e0.character);
          pTVar6 = (Twine *)(plVar4 + 2);
          if (((unsigned_long *)*plVar4).twine == pTVar6) {
            local_1030 = (pTVar6->LHS).twine;
            uStack_1028 = (undefined4)plVar4[3];
            uStack_1024 = *(undefined4 *)((long)plVar4 + 0x1c);
            local_1040.twine = (Twine *)&local_1030;
          }
          else {
            local_1030 = (pTVar6->LHS).twine;
            local_1040.decUL = ((unsigned_long *)*plVar4).decUL;
          }
          local_1038 = plVar4[1];
          *plVar4 = (long)pTVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          (*pBVar3->_vptr_BuildSystemDelegate[0xb])(pBVar3,this,local_1040.twine);
          if (local_1040.twine != (Twine *)&local_1030) {
            operator_delete(local_1040.twine,(ulong)((long)&local_1030->LHS + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10e0.twine != &local_10d0) {
            operator_delete(local_10e0.twine,
                            CONCAT71(local_10d0._M_allocated_capacity._1_7_,
                                     local_10d0._M_local_buf[0]) + 1);
          }
          goto LAB_00177d54;
        }
        switch(this->depsStyle) {
        case Unused:
          __assert_fail("0 && \"unreachable\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ShellCommand.cpp"
                        ,0x68,
                        "bool llbuild::buildsystem::ShellCommand::processDiscoveredDependencies(BuildSystem &, core::TaskInterface, QueueJobContext *)"
                       );
        case Makefile:
          pcVar7 = (Str->_M_dataplus)._M_p;
          sVar8 = Str->_M_string_length;
          bVar1 = false;
          local_1080 = pcVar7;
          sStack_1078 = sVar8;
          break;
        case DependencyInfo:
          local_1090 = (Str->_M_dataplus)._M_p;
          sStack_1088 = Str->_M_string_length;
          depsPath_00.Data = (Str->_M_dataplus)._M_p;
          depsPath_00.Length = Str->_M_string_length;
          bVar1 = processDependencyInfoDiscoveredDependencies
                            (this,system,ti,context,depsPath_00,(MemoryBuffer *)input.twine);
          goto LAB_00177d00;
        case MakefileIgnoringSubsequentOutputs:
          pcVar7 = (Str->_M_dataplus)._M_p;
          sVar8 = Str->_M_string_length;
          bVar1 = true;
          local_10a0 = pcVar7;
          sStack_1098 = sVar8;
          break;
        default:
          llvm::report_fatal_error("unknown dependencies style",true);
        }
        depsPath.Length = sVar8;
        depsPath.Data = pcVar7;
        bVar1 = processMakefileDiscoveredDependencies
                          (this,system,ti,context,depsPath,(MemoryBuffer *)input.twine,bVar1);
LAB_00177d00:
        (**(code **)(*input.decUL + 8))(input.twine);
        if (bVar1 == false) goto LAB_00177d54;
        Str = Str + 1;
        local_10c0 = local_10c0 + -0x20;
      } while (local_10c0 != 0);
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool ShellCommand::processDiscoveredDependencies(BuildSystem& system,
                                                 core::TaskInterface ti,
                                                 QueueJobContext* context) {
  // It is an error if the dependencies style is not specified.
  //
  // FIXME: Diagnose this sooner.
  if (depsStyle == DepsStyle::Unused) {
    system.getDelegate().commandHadError(
        this, "missing required 'deps-style' specifier");
    return false;
  }

  for (const auto& depsPath: depsPaths) {
    // Read the dependencies file.
    std::unique_ptr<llvm::MemoryBuffer> input;
    if (llvm::sys::path::is_absolute(depsPath)) {
      input = system.getFileSystem().getFileContents(depsPath);
    } else {
      SmallString<PATH_MAX> absPath = StringRef(workingDirectory);
      llvm::sys::path::append(absPath, depsPath);
      llvm::sys::fs::make_absolute(absPath);
      input = system.getFileSystem().getFileContents(StringRef(absPath));
    }
    if (!input) {
      system.getDelegate().commandHadError(
          this, "unable to open dependencies file (" + depsPath + ")");
      return false;
    }

    switch (depsStyle) {
    case DepsStyle::Unused:
      assert(0 && "unreachable");
      break;

    case DepsStyle::Makefile:
      if (!processMakefileDiscoveredDependencies(
              system, ti, context, depsPath, input.get(), false))
        return false;
      continue;

    case DepsStyle::DependencyInfo:
      if (!processDependencyInfoDiscoveredDependencies(
              system, ti, context, depsPath, input.get()))
        return false;
      continue;

    case DepsStyle::MakefileIgnoringSubsequentOutputs:
      if (!processMakefileDiscoveredDependencies(
              system, ti, context, depsPath, input.get(), true))
        return false;
      continue;
    }
      
    llvm::report_fatal_error("unknown dependencies style");
  }

  return true;
}